

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O1

void __thiscall xray_re::xr_motion::load(xr_motion *this,xr_reader *r)

{
  uint32_t *puVar1;
  float *pfVar2;
  
  xr_reader::r_sz(r,&this->m_name);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_frame_start = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->m_frame_end = *puVar1;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->m_fps = *pfVar2;
  return;
}

Assistant:

void xr_motion::load(xr_reader& r)
{
	r.r_sz(m_name);
	m_frame_start = r.r_s32();
	m_frame_end = r.r_s32();
	m_fps = r.r_float();
}